

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall
choc::value::Type::addArrayElements(Type *this,Type *elementType,uint32_t numElementsToAdd)

{
  Content *pCVar1;
  char **ppcVar2;
  Content *pCVar3;
  MainType MVar4;
  uint32_t uVar5;
  MemberNameAndType *pMVar6;
  Allocator *pAVar7;
  RepeatedGroup *pRVar8;
  Object *pOVar9;
  Object *this_00;
  Object *this_01;
  bool bVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this_02;
  ulong uVar12;
  undefined8 unaff_RBP;
  ulong uVar13;
  MainType MVar15;
  Object *this_03;
  Object *pOVar16;
  undefined8 local_98;
  uint32_t local_90;
  MainType local_78;
  Vector local_70;
  Object *local_68;
  Allocator *local_58;
  MainType local_50;
  byte local_48;
  uint uVar11;
  undefined7 uVar14;
  
  MVar4 = elementType->mainType;
  if (MVar4 == void_) {
    throwError("Element type cannot be void");
  }
  if (this->mainType == complexArray) goto LAB_001edeec;
  if (this->mainType != primitiveArray) {
    throwError("Cannot add new elements to this type");
  }
  uVar11 = (this->content).primitiveArray.numVectorElements;
  MVar15 = (this->content).vector.elementType;
  if (uVar11 == 0) {
    local_98 = (Object *)0x0;
  }
  else {
    if (0x100 < uVar11) goto LAB_001ee137;
    local_98 = (Object *)CONCAT44(uVar11,(uint)MVar15);
    MVar15 = vector;
  }
  if (MVar4 == MVar15) {
    uVar14 = (undefined7)((ulong)unaff_RBP >> 8);
    uVar13 = CONCAT71(uVar14,1);
    if (MVar4 < complexArray) {
      if (MVar4 == vector) {
        uVar13 = CONCAT71(uVar14,(elementType->content).vector.numElements == local_98._4_4_ &&
                                 (elementType->content).vector.elementType == (MainType)local_98);
      }
      else if (MVar4 == primitiveArray) {
        if (((elementType->content).vector.elementType != (MainType)local_98) ||
           ((elementType->content).vector.numElements != local_98._4_4_)) goto LAB_001edc3d;
        uVar13 = CONCAT71(uVar14,(elementType->content).primitiveArray.numVectorElements == local_90
                         );
      }
    }
    else {
      if (MVar4 == complexArray) {
        bVar10 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
                           ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                            (elementType->content).object,
                            (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                            local_98);
        uVar11 = (uint)CONCAT71(extraout_var_00,bVar10);
      }
      else {
        if (MVar4 != object) goto LAB_001edc8b;
        bVar10 = Object::operator==((elementType->content).object,local_98);
        uVar11 = (uint)CONCAT71(extraout_var,bVar10);
      }
      uVar13 = (ulong)uVar11;
    }
  }
  else {
LAB_001edc3d:
    uVar13 = 0;
  }
LAB_001edc8b:
  if ((char)MVar15 < '\0') {
    if (MVar15 == object) {
      if (local_98 != (Object *)0x0) {
        Object::~Object(local_98);
        goto LAB_001edf6d;
      }
    }
    else if ((MVar15 == complexArray) && (local_98 != (Object *)0x0)) {
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)local_98);
LAB_001edf6d:
      free(local_98);
    }
  }
  uVar5 = (this->content).vector.numElements;
  if ((char)uVar13 != '\0') {
    (this->content).vector.numElements = uVar5 + numElementsToAdd;
    return;
  }
  if (uVar5 != 0) {
    this->mainType = complexArray;
    if (this->allocator == (Allocator *)0x0) {
      this_02 = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)malloc(0x18);
    }
    else {
      this_02 = (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                (**(code **)(*(long *)this->allocator + 0x10))();
    }
    pAVar7 = this->allocator;
    this_02->items = (RepeatedGroup *)0x0;
    this_02->size = 0;
    this_02->capacity = 0;
    this_02->allocator = pAVar7;
    uVar5 = (this->content).vector.numElements;
    local_70.numElements = (this->content).primitiveArray.numVectorElements;
    MVar4 = (this->content).vector.elementType;
    if (local_70.numElements == 0) {
      local_70.elementType = void_;
      local_70._1_3_ = 0;
      local_70.numElements = 0;
      local_78 = MVar4;
    }
    else {
      local_78 = vector;
      if (0x100 < local_70.numElements) {
LAB_001ee137:
        throwError("Too many vector elements");
      }
      local_70._1_3_ = 0;
      local_70.elementType = MVar4;
    }
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
              (this_02,this_02->size + 1);
    pRVar8 = this_02->items;
    uVar11 = this_02->size;
    pRVar8[uVar11].repetitions = uVar5;
    pRVar8[uVar11].elementType.mainType = local_78;
    pCVar1 = &pRVar8[uVar11].elementType.content;
    pCVar1->vector = local_70;
    (&pCVar1->object)[1] = local_68;
    pRVar8[uVar11].elementType.allocator = (Allocator *)0x0;
    this_02->size = this_02->size + 1;
    (this->content).complexArray = (ComplexArray *)this_02;
LAB_001edeec:
    ComplexArray::addElements((this->content).complexArray,elementType,numElementsToAdd);
    return;
  }
  MVar4 = elementType->mainType;
  uVar12 = (ulong)MVar4;
  pCVar1 = &elementType->content;
  uVar11 = (elementType->content).vector.numElements;
  this_01 = pCVar1->object;
  this_00 = pCVar1->object;
  pOVar16 = pCVar1->object;
  pOVar9 = *(Object **)((long)&elementType->content + 8);
  pAVar7 = elementType->allocator;
  elementType->mainType = void_;
  if (0xfffff < numElementsToAdd) {
    throwError("Too many array elements");
  }
  pMVar6 = (MemberNameAndType *)this->allocator;
  if (MVar4 < (vector|boolean)) {
    if ((0x1100112UL >> (uVar12 & 0x3f) & 1) == 0) {
      if (uVar12 != 0x30) goto LAB_001edfce;
      local_48 = (byte)*(undefined4 *)pCVar1;
      uVar13 = (ulong)uVar11;
      this_03 = (Object *)((ulong)numElementsToAdd << 0x20 | (ulong)local_48);
    }
    else {
      this_03 = (Object *)((ulong)numElementsToAdd << 0x20 | uVar12);
      uVar13 = 0;
    }
    MVar15 = primitiveArray;
    local_50 = MVar4;
  }
  else {
LAB_001edfce:
    if (pMVar6 == (MemberNameAndType *)0x0) {
      this_03 = (Object *)malloc(0x18);
    }
    else {
      this_03 = (Object *)(**(code **)((pMVar6->name)._M_len + 0x10))(pMVar6,0x18);
    }
    (this_03->className)._M_len = 0;
    (this_03->className)._M_str = (char *)0x0;
    (this_03->members).items = pMVar6;
    local_50 = void_;
    AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
              ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)this_03,
               *(uint32_t *)&(this_03->className)._M_str + 1);
    pRVar8 = (RepeatedGroup *)(this_03->className)._M_len;
    uVar11 = *(uint *)&(this_03->className)._M_str;
    pRVar8[uVar11].repetitions = numElementsToAdd;
    pRVar8[uVar11].elementType.mainType = MVar4;
    pCVar3 = &pRVar8[uVar11].elementType.content;
    pCVar3->object = pOVar16;
    (&pCVar3->object)[1] = pOVar9;
    pRVar8[uVar11].elementType.allocator = pAVar7;
    ppcVar2 = &(this_03->className)._M_str;
    *(uint32_t *)ppcVar2 = *(uint32_t *)ppcVar2 + 1;
    MVar15 = complexArray;
  }
  MVar4 = this->mainType;
  if ((char)MVar4 < '\0') {
    if (MVar4 == object) {
      pOVar16 = (this->content).object;
      if (pOVar16 != (Object *)0x0) {
        local_58 = this->allocator;
        Object::~Object(pOVar16);
        goto LAB_001ee045;
      }
    }
    else if ((MVar4 == complexArray) && (pOVar16 = (this->content).object, pOVar16 != (Object *)0x0)
            ) {
      local_58 = this->allocator;
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)pOVar16);
LAB_001ee045:
      if (local_58 == (Allocator *)0x0) {
        free(pOVar16);
      }
      else {
        (**(code **)(*(long *)local_58 + 0x20))(local_58,pOVar16);
      }
    }
  }
  this->mainType = MVar15;
  (this->content).object = this_03;
  *(ulong *)((long)&this->content + 8) = uVar13;
  this->allocator = (Allocator *)pMVar6;
  if ((char)local_50 < '\0') {
    if (local_50 == object) {
      if (this_01 != (Object *)0x0) {
        Object::~Object(this_01);
        goto LAB_001ee005;
      }
    }
    else if ((local_50 == complexArray) && (this_00 != (Object *)0x0)) {
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)this_00);
LAB_001ee005:
      if (pAVar7 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar7 + 0x20))(pAVar7,pCVar1->object);
        return;
      }
      free(pCVar1->object);
      return;
    }
  }
  return;
}

Assistant:

bool isType (Types... types) const noexcept   { return ((mainType == types) || ...); }